

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::ReferenceRenderer::draw
          (ReferenceRenderer *this,RenderState *renderState,PrimitiveType primitive,
          vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
          *vertexBuffer)

{
  pointer pVVar1;
  size_t vertexNdx;
  ulong uVar2;
  long lVar3;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texCoords;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> positions;
  PrimitiveList primitives;
  DrawCommand local_b8;
  VertexAttrib local_88;
  undefined8 uStack_60;
  undefined8 local_58;
  pointer pVStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar3 = 0;
  rr::PrimitiveList::PrimitiveList
            (&primitives,primitive,
             (int)((ulong)((long)(vertexBuffer->
                                 super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(vertexBuffer->
                                super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 5),0);
  positions.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  texCoords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texCoords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  texCoords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar2 = 0;
      pVVar1 = (vertexBuffer->
               super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(vertexBuffer->
                            super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 5);
      uVar2 = uVar2 + 1) {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (&positions,(value_type *)((long)(pVVar1->position).m_data + lVar3));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (&texCoords,(value_type *)((long)(pVVar1->texCoord).m_data + lVar3));
    lVar3 = lVar3 + 0x20;
  }
  local_b8.vertexAttribs = &local_88;
  local_88.stride = 0;
  local_88.instanceDivisor = 0;
  local_88.generic.v._0_8_ = 0;
  local_88.generic.v._8_8_ = 0;
  local_58 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_88.type = VERTEXATTRIBTYPE_FLOAT;
  local_88.size = 4;
  local_88.pointer =
       positions.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  uStack_60 = 0x400000000;
  pVStack_50 = texCoords.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
  local_b8.renderTarget = this->m_renderTarget;
  local_b8.program = this->m_program;
  local_b8.numVertexAttribs = 2;
  local_b8.primitives = &primitives;
  local_b8.state = renderState;
  rr::Renderer::draw(&this->m_renderer,&local_b8);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&texCoords.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&positions.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return;
}

Assistant:

void ReferenceRenderer::draw (const rr::RenderState&			renderState,
							  const rr::PrimitiveType			primitive,
							  const std::vector<Vertex4Tex4>&	vertexBuffer)
{
	const rr::PrimitiveList primitives(primitive, (int)vertexBuffer.size(), 0);

	std::vector<tcu::Vec4> positions;
	std::vector<tcu::Vec4> texCoords;

	for (size_t vertexNdx = 0; vertexNdx < vertexBuffer.size(); vertexNdx++)
	{
		const Vertex4Tex4& v = vertexBuffer[vertexNdx];
		positions.push_back(v.position);
		texCoords.push_back(v.texCoord);
	}

	rr::VertexAttrib vertexAttribs[2];

	// Position attribute
	vertexAttribs[0].type		= rr::VERTEXATTRIBTYPE_FLOAT;
	vertexAttribs[0].size		= 4;
	vertexAttribs[0].pointer	= positions.data();
	// UV attribute
	vertexAttribs[1].type		= rr::VERTEXATTRIBTYPE_FLOAT;
	vertexAttribs[1].size		= 4;
	vertexAttribs[1].pointer	= texCoords.data();

	rr::DrawCommand drawQuadCommand(renderState, *m_renderTarget, *m_program, 2, vertexAttribs, primitives);

	m_renderer.draw(drawQuadCommand);
}